

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

char * google::protobuf::compiler::cpp::DeclaredTypeMethodName(Type type)

{
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  Type local_14;
  char *pcStack_10;
  Type type_local;
  
  switch(type) {
  case TYPE_DOUBLE:
    pcStack_10 = "Double";
    break;
  case TYPE_FLOAT:
    pcStack_10 = "Float";
    break;
  case TYPE_INT64:
    pcStack_10 = "Int64";
    break;
  case TYPE_UINT64:
    pcStack_10 = "UInt64";
    break;
  case TYPE_INT32:
    pcStack_10 = "Int32";
    break;
  case TYPE_FIXED64:
    pcStack_10 = "Fixed64";
    break;
  case TYPE_FIXED32:
    pcStack_10 = "Fixed32";
    break;
  case TYPE_BOOL:
    pcStack_10 = "Bool";
    break;
  case TYPE_STRING:
    pcStack_10 = "String";
    break;
  case TYPE_GROUP:
    pcStack_10 = "Group";
    break;
  case TYPE_MESSAGE:
    pcStack_10 = "Message";
    break;
  case TYPE_BYTES:
    pcStack_10 = "Bytes";
    break;
  case TYPE_UINT32:
    pcStack_10 = "UInt32";
    break;
  case TYPE_ENUM:
    pcStack_10 = "Enum";
    break;
  case TYPE_SFIXED32:
    pcStack_10 = "SFixed32";
    break;
  case TYPE_SFIXED64:
    pcStack_10 = "SFixed64";
    break;
  case TYPE_SINT32:
    pcStack_10 = "SInt32";
    break;
  case MAX_TYPE:
    pcStack_10 = "SInt64";
    break;
  default:
    local_14 = type;
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0xff);
    other = internal::LogMessage::operator<<(&local_50,"Can\'t get here.");
    internal::LogFinisher::operator=(local_5d,other);
    internal::LogMessage::~LogMessage(&local_50);
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* DeclaredTypeMethodName(FieldDescriptor::Type type) {
  switch (type) {
    case FieldDescriptor::TYPE_INT32   : return "Int32";
    case FieldDescriptor::TYPE_INT64   : return "Int64";
    case FieldDescriptor::TYPE_UINT32  : return "UInt32";
    case FieldDescriptor::TYPE_UINT64  : return "UInt64";
    case FieldDescriptor::TYPE_SINT32  : return "SInt32";
    case FieldDescriptor::TYPE_SINT64  : return "SInt64";
    case FieldDescriptor::TYPE_FIXED32 : return "Fixed32";
    case FieldDescriptor::TYPE_FIXED64 : return "Fixed64";
    case FieldDescriptor::TYPE_SFIXED32: return "SFixed32";
    case FieldDescriptor::TYPE_SFIXED64: return "SFixed64";
    case FieldDescriptor::TYPE_FLOAT   : return "Float";
    case FieldDescriptor::TYPE_DOUBLE  : return "Double";

    case FieldDescriptor::TYPE_BOOL    : return "Bool";
    case FieldDescriptor::TYPE_ENUM    : return "Enum";

    case FieldDescriptor::TYPE_STRING  : return "String";
    case FieldDescriptor::TYPE_BYTES   : return "Bytes";
    case FieldDescriptor::TYPE_GROUP   : return "Group";
    case FieldDescriptor::TYPE_MESSAGE : return "Message";

    // No default because we want the compiler to complain if any new
    // types are added.
  }
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}